

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::updateTiles(Board *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  bool bVar3;
  _Node_iterator_base<TileGate_*,_false> __it;
  ostream *poVar4;
  uint x;
  pointer ppTVar5;
  ulong uVar6;
  uint y;
  ulong uVar7;
  pointer ppTVar8;
  TileGate *gate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (((((this->wireUpdates)._M_h._M_element_count != 0) ||
       ((this->gateUpdates)._M_h._M_element_count != 0)) ||
      ((this->switchUpdates)._M_h._M_element_count != 0)) ||
     (((this->buttonUpdates)._M_h._M_element_count != 0 ||
      ((this->LEDUpdates)._M_h._M_element_count != 0)))) {
    __it._M_cur = (__node_type *)(this->gateUpdates)._M_h._M_before_begin._M_nxt;
    while (__it._M_cur != (__node_type *)0x0) {
      bVar3 = TileGate::updateNextState
                        ((TileGate *)
                         ((__it._M_cur)->super__Hash_node_value<TileGate_*,_false>).
                         super__Hash_node_value_base<TileGate_*>._M_storage._M_storage);
      if (bVar3) {
        __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
      }
      else {
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<TileGate_*,_TileGate_*,_std::allocator<TileGate_*>,_std::__detail::_Identity,_std::equal_to<TileGate_*>,_std::hash<TileGate_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::erase(&(this->gateUpdates)._M_h,__it._M_cur);
      }
    }
    while ((this->switchUpdates)._M_h._M_element_count != 0) {
      TileSwitch::updateOutput
                ((TileSwitch *)(this->switchUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    while ((this->buttonUpdates)._M_h._M_element_count != 0) {
      TileButton::updateOutput
                ((TileButton *)(this->buttonUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    while ((this->gateUpdates)._M_h._M_element_count != 0) {
      TileGate::updateOutput((TileGate *)(this->gateUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt);
    }
    while ((this->wireUpdates)._M_h._M_element_count != 0) {
      TileWire::updateWire
                ((TileWire *)(this->wireUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt,LOW);
    }
    while (ppTVar1 = endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          ppTVar8 = endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
                    super__Vector_impl_data._M_start, (this->LEDUpdates)._M_h._M_element_count != 0)
    {
      TileLED::updateLED((TileLED *)(this->LEDUpdates)._M_h._M_before_begin._M_nxt[1]._M_nxt,LOW);
    }
    for (; ppTVar2 = endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish, ppTVar8 != ppTVar1;
        ppTVar8 = ppTVar8 + 1) {
      TileLED::updateLED(*ppTVar8,LOW);
    }
    if (endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           endpointLEDs.super__Vector_base<TileLED_*,_std::allocator<TileLED_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    for (ppTVar5 = endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppTVar5 != ppTVar2; ppTVar5 = ppTVar5 + 1) {
      gate = *ppTVar5;
      std::__detail::
      _Insert_base<TileGate_*,_TileGate_*,_std::allocator<TileGate_*>,_std::__detail::_Identity,_std::equal_to<TileGate_*>,_std::hash<TileGate_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<TileGate_*,_TileGate_*,_std::allocator<TileGate_*>,_std::__detail::_Identity,_std::equal_to<TileGate_*>,_std::hash<TileGate_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->gateUpdates,&gate);
    }
    if (endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           endpointGates.super__Vector_base<TileGate_*,_std::allocator<TileGate_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    TileButton::updateTransitioningButtons();
    if (Tile::currentUpdateTime == 0xffffffff) {
      std::__cxx11::to_string(&local_50,0xffffffff);
      std::operator+(&local_70,"Update counter has reached max value (",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gate,
                     &local_70," updates), resetting tiles...");
      UserInterface::pushMessage((string *)&gate,false);
      std::__cxx11::string::~string((string *)&gate);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      for (uVar7 = 0; uVar7 < (this->_size).y; uVar7 = uVar7 + 1) {
        for (uVar6 = 0; uVar6 < (this->_size).x; uVar6 = uVar6 + 1) {
          (*this->_tileArray[uVar7][uVar6]->_vptr_Tile[0xc])();
        }
      }
      Tile::currentUpdateTime = 1;
      poVar4 = std::operator<<((ostream *)&std::cout,"Tiles reset.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      Tile::currentUpdateTime = Tile::currentUpdateTime + 1;
    }
  }
  return;
}

Assistant:

void Board::updateTiles() {
    assert(endpointLEDs.empty());
    assert(endpointGates.empty());
    if (wireUpdates.empty() && gateUpdates.empty() && switchUpdates.empty() && buttonUpdates.empty() && LEDUpdates.empty()) {
        return;
    }
    /*if (!wireUpdates.empty() || !gateUpdates.empty() || !switchUpdates.empty() || !buttonUpdates.empty() || !LEDUpdates.empty()) {
        cout << "\nUpdates scheduled: w" << wireUpdates.size() << " g" << gateUpdates.size() << " s" << switchUpdates.size() << " b" << buttonUpdates.size() << " L" << LEDUpdates.size() << endl;
    }*/
    
    //cout << "---- GATE STATE CHECKS ----" << endl;
    for (auto setIter = gateUpdates.begin(); setIter != gateUpdates.end();) {    // Check state transitions for all gates (keep update only if gate changed).
        if ((*setIter)->updateNextState()) {
            ++setIter;
        } else {
            setIter = gateUpdates.erase(setIter);
        }
    }
    
    //cout << "---- SWITCH UPDATES ----" << endl;
    while (!switchUpdates.empty()) {    // Update all pending switches.
        (*switchUpdates.begin())->updateOutput();
    }
    //cout << "---- BUTTON UPDATES ----" << endl;
    while (!buttonUpdates.empty()) {    // Update all pending buttons.
        (*buttonUpdates.begin())->updateOutput();
    }
    //cout << "---- GATE UPDATES ----" << endl;
    while (!gateUpdates.empty()) {    // Update all pending gates that were left over from before.
        (*gateUpdates.begin())->updateOutput();
    }
    
    //cout << "---- REMAINING WIRES AND LEDS ----" << endl;
    while (!wireUpdates.empty()) {
        //cout << "Found a remaining wire update." << endl;
        (*wireUpdates.begin())->updateWire(LOW);
    }
    while (!LEDUpdates.empty()) {
        //cout << "Found a remaining LED update." << endl;
        (*LEDUpdates.begin())->updateLED(LOW);
    }
    
    //cout << "LED endpoints:" << endl;
    for (TileLED* LED : endpointLEDs) {
        //cout << "  (" << LED->getPosition().x << ", " << LED->getPosition().y << ")" << endl;
        LED->updateLED(LOW);
    }
    endpointLEDs.clear();
    //cout << "Gate endpoints:" << endl;
    for (TileGate* gate : endpointGates) {
        //cout << "  (" << gate->getPosition().x << ", " << gate->getPosition().y << ")" << endl;
        gateUpdates.insert(gate);
    }
    endpointGates.clear();
    
    TileButton::updateTransitioningButtons();
    //cout << endl;
    if (Tile::currentUpdateTime == numeric_limits<unsigned int>::max()) {
        UserInterface::pushMessage("Update counter has reached max value (" + to_string(numeric_limits<unsigned int>::max()) + " updates), resetting tiles...");
        for (unsigned int y = 0; y < _size.y; ++y) {
            for (unsigned int x = 0; x < _size.x; ++x) {
                _tileArray[y][x]->fixUpdateTime();
            }
        }
        Tile::currentUpdateTime = 1;
        cout << "Tiles reset." << endl;
    } else {
        ++Tile::currentUpdateTime;
    }
}